

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O3

void ares_llist_node_mvparent_last(ares_llist_node_t *node,ares_llist_t *new_parent)

{
  ares_llist_node_t *paVar1;
  
  if (new_parent != (ares_llist_t *)0x0 && node != (ares_llist_node_t *)0x0) {
    ares_llist_node_detach(node);
    node->parent = new_parent;
    node->next = (ares_llist_node_t *)0x0;
    paVar1 = new_parent->tail;
    node->prev = paVar1;
    if (paVar1 != (ares_llist_node_t *)0x0) {
      paVar1->next = node;
    }
    new_parent->tail = node;
    if (new_parent->head == (ares_llist_node_t *)0x0) {
      new_parent->head = node;
    }
    new_parent->cnt = new_parent->cnt + 1;
  }
  return;
}

Assistant:

void ares_llist_node_mvparent_last(ares_llist_node_t *node,
                                   ares_llist_t      *new_parent)
{
  if (node == NULL || new_parent == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_llist_node_detach(node);
  ares_llist_attach_at(new_parent, ARES__LLIST_INSERT_TAIL, NULL, node);
}